

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O2

void solver_cancel_until(solver_t *s,uint level)

{
  uint uVar1;
  heap_t *p;
  vec_int_t *pvVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *__function;
  uint i;
  uint uVar6;
  char *__file;
  vec_uint_t *pvVar7;
  char *__assertion;
  
  pvVar7 = s->trail_lim;
  if (pvVar7->size <= level) {
    return;
  }
  uVar6 = s->trail->size;
  do {
    uVar3 = vec_uint_at(pvVar7,level);
    if (uVar6 <= uVar3) {
      uVar6 = vec_uint_at(s->trail_lim,level);
      s->i_qhead = uVar6;
      pvVar7 = s->trail;
      uVar6 = vec_uint_at(s->trail_lim,level);
      vec_uint_shrink(pvVar7,uVar6);
      vec_uint_shrink(s->trail_lim,level);
      return;
    }
    uVar6 = uVar6 - 1;
    uVar3 = vec_uint_at(s->trail,uVar6);
    uVar3 = uVar3 >> 1;
    vec_char_assign(s->assigns,uVar3,'\x03');
    vec_uint_assign(s->reasons,uVar3,0xffffffff);
    iVar4 = heap_in_heap(s->var_order,uVar3);
    if (iVar4 == 0) {
      p = s->var_order;
      pvVar2 = p->indices;
      i = pvVar2->size;
      if (i <= uVar3) {
        uVar1 = uVar3 + 1;
        pvVar2->size = uVar1;
        if (pvVar2->cap <= uVar3) {
          piVar5 = (int *)realloc(pvVar2->data,(ulong)uVar1 << 2);
          pvVar2->data = piVar5;
          if (piVar5 == (int *)0x0) {
            __assertion = "p->data != NULL";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
            ;
            __function = "void vec_int_resize(vec_int_t *, unsigned int)";
            uVar6 = 0x5e;
            goto LAB_0071e8be;
          }
          pvVar2->cap = uVar1;
        }
        for (; i < p->indices->size; i = i + 1) {
          vec_int_at(p->indices,i);
          vec_int_assign(p->indices,i,-1);
        }
      }
      iVar4 = heap_in_heap(p,uVar3);
      if (iVar4 != 0) {
        __assertion = "!heap_in_heap(p, entry)";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/heap.h"
        ;
        __function = "void heap_insert(heap_t *, unsigned int)";
        uVar6 = 0x7f;
LAB_0071e8be:
        __assert_fail(__assertion,__file,uVar6,__function);
      }
      vec_int_assign(p->indices,uVar3,p->data->size);
      vec_uint_push_back(p->data,uVar3);
      uVar3 = vec_int_at(p->indices,uVar3);
      heap_percolate_up(p,uVar3);
    }
    pvVar7 = s->trail_lim;
  } while( true );
}

Assistant:

void solver_cancel_until(solver_t *s, unsigned level)
{
    unsigned i;

    if (solver_dlevel(s) <= level)
        return;
    for (i = vec_uint_size(s->trail); i --> vec_uint_at(s->trail_lim, level);) {
        unsigned var = lit2var(vec_uint_at(s->trail, i));

        vec_char_assign(s->assigns, var, SATOKO_VAR_UNASSING);
        vec_uint_assign(s->reasons, var, UNDEF);
        if (!heap_in_heap(s->var_order, var))
            heap_insert(s->var_order, var);
    }
    s->i_qhead = vec_uint_at(s->trail_lim, level);
    vec_uint_shrink(s->trail, vec_uint_at(s->trail_lim, level));
    vec_uint_shrink(s->trail_lim, level);
}